

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is)

{
  Ch CVar1;
  bool bVar2;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RSI;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RDI;
  ParseErrorCode in_stack_ffffffffffffff8c;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is_00;
  
  is_00 = in_RDI;
  SkipWhitespace<rapidjson::BasicIStreamWrapper<std::istream>>(in_RDI);
  do {
    CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
    if (CVar1 != '/') {
      return;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(in_RDI);
    CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
    if (CVar1 == '*') {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(in_RDI);
      do {
        while( true ) {
          while (CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::
                         Peek(in_RSI), CVar1 == '\0') {
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)in_RDI,in_stack_ffffffffffffff8c,0x23e472);
            bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                     *)0x23e47e);
            if (bVar2) {
              return;
            }
          }
          CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (in_RSI);
          if (CVar1 == '*') break;
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(in_RDI);
        }
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(in_RDI);
        CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                          (in_RSI);
      } while (CVar1 != '/');
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(in_RDI);
    }
    else {
      CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek(in_RSI);
      if (CVar1 == '/') {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(in_RDI);
        do {
          CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                            (in_RSI);
          in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
          if (CVar1 != '\0') {
            CVar1 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                              (in_RDI);
            in_stack_ffffffffffffff8c = CONCAT13(CVar1 != '\n',(int3)in_stack_ffffffffffffff8c);
          }
        } while ((char)(in_stack_ffffffffffffff8c >> 0x18) != '\0');
      }
      else {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(in_RSI);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)in_RDI,in_stack_ffffffffffffff8c,0x23e5f5);
        bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)0x23e601);
        if (bVar2) {
          return;
        }
      }
    }
    SkipWhitespace<rapidjson::BasicIStreamWrapper<std::istream>>(is_00);
  } while( true );
}

Assistant:

void SkipWhitespaceAndComments(InputStream& is) {
        SkipWhitespace(is);

        if (parseFlags & kParseCommentsFlag) {
            while (RAPIDJSON_UNLIKELY(Consume(is, '/'))) {
                if (Consume(is, '*')) {
                    while (true) {
                        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0'))
                            RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());
                        else if (Consume(is, '*')) {
                            if (Consume(is, '/'))
                                break;
                        }
                        else
                            is.Take();
                    }
                }
                else if (RAPIDJSON_LIKELY(Consume(is, '/')))
                    while (is.Peek() != '\0' && is.Take() != '\n') {}
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());

                SkipWhitespace(is);
            }
        }
    }